

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::InitOutputPathPrefix(cmGlobalNinjaGenerator *this)

{
  string *psVar1;
  cmMakefile *this_00;
  size_type sVar2;
  string local_40;
  
  this_00 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_NINJA_OUTPUT_PATH_PREFIX","");
  cmMakefile::GetSafeDefinition(this_00,&local_40);
  psVar1 = &this->OutputPathPrefix;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  sVar2 = (this->OutputPathPrefix)._M_string_length;
  if ((sVar2 != 0) && ((psVar1->_M_dataplus)._M_p[sVar2 - 1] != '/')) {
    std::__cxx11::string::push_back((char)psVar1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::InitOutputPathPrefix()
{
  this->OutputPathPrefix =
    this->LocalGenerators[0]->GetMakefile()->GetSafeDefinition(
      "CMAKE_NINJA_OUTPUT_PATH_PREFIX");
  EnsureTrailingSlash(this->OutputPathPrefix);
}